

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O3

void __thiscall
cmCommandArgumentParserHelper::SetResult(cmCommandArgumentParserHelper *this,char *value)

{
  char *pcVar1;
  
  if (value != (char *)0x0) {
    pcVar1 = (char *)(this->Result)._M_string_length;
    strlen(value);
    std::__cxx11::string::_M_replace((ulong)&this->Result,0,pcVar1,(ulong)value);
    return;
  }
  (this->Result)._M_string_length = 0;
  *(this->Result)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void cmCommandArgumentParserHelper::SetResult(const char* value)
{
  if (!value) {
    this->Result.clear();
    return;
  }
  this->Result = value;
}